

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

void __thiscall QHstsCache::updateFromHeaders(QHstsCache *this,QHttpHeaders *headers,QUrl *url)

{
  bool bVar1;
  ulong uVar2;
  QHstsHeaderParser *in_RDX;
  QDateTime *in_RSI;
  QHstsHeaderParser *in_RDI;
  long in_FS_OFFSET;
  QHstsHeaderParser parser;
  QHstsHeaderParser *pQVar3;
  undefined1 includeSubDomains;
  QHstsHeaderParser *this_00;
  QHstsHeaderParser *in_stack_ffffffffffffff80;
  undefined1 local_70 [24];
  QHstsHeaderParser local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QUrl::isValid();
  if ((uVar2 & 1) != 0) {
    memset(&local_58,0xaa,0x50);
    QHstsHeaderParser::QHstsHeaderParser(in_RDI);
    bVar1 = QHstsHeaderParser::parse(in_stack_ffffffffffffff80,(QHttpHeaders *)this_00);
    if (bVar1) {
      pQVar3 = in_RDX;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)in_RDI,
                 (ComponentFormattingOption)((ulong)in_RDX >> 0x20));
      includeSubDomains = (undefined1)((ulong)pQVar3 >> 0x38);
      QUrl::host((QFlags_conflict *)local_70);
      QHstsHeaderParser::expirationDate(in_RDX);
      QHstsHeaderParser::includeSubDomains(&local_58);
      updateKnownHost((QHstsCache *)in_stack_ffffffffffffff80,(QString *)this_00,in_RSI,
                      (bool)includeSubDomains);
      QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffff80);
      QString::~QString((QString *)0x1791cf);
      if (*(long *)&in_RDI->expiry != 0) {
        QHstsStore::synchronize((QHstsStore *)this_00);
      }
    }
    QHstsHeaderParser::~QHstsHeaderParser(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHstsCache::updateFromHeaders(const QHttpHeaders &headers,
                                   const QUrl &url)
{
    if (!url.isValid())
        return;

    QHstsHeaderParser parser;
    if (parser.parse(headers)) {
        updateKnownHost(url.host(), parser.expirationDate(), parser.includeSubDomains());
#if QT_CONFIG(settings)
        if (hstsStore)
            hstsStore->synchronize();
#endif // QT_CONFIG(settings)
    }
}